

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QJsonObject convertToJsonObject(QCborContainerPrivate *d,ConversionMode mode)

{
  ConversionMode in_EDX;
  undefined4 in_register_00000034;
  QCborContainerPrivate *d_00;
  ulong idx;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QJsonValue local_50;
  long local_38;
  
  d_00 = (QCborContainerPrivate *)CONCAT44(in_register_00000034,mode);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)d = &DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)d);
  if (d_00 != (QCborContainerPrivate *)0x0) {
    for (idx = 0; idx < (ulong)(d_00->elements).d.size; idx = idx + 2) {
      makeString((QString *)&QStack_68,d_00,idx,FromRaw);
      qt_convertToJson(&local_50,d_00,idx + 1,in_EDX);
      QJsonObject::insert((QJsonObject *)d,(QString *)&QStack_68,&local_50);
      QJsonValue::~QJsonValue(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)d;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonObject convertToJsonObject(QCborContainerPrivate *d,
                                       ConversionMode mode = ConversionMode::FromRaw)
{
    QJsonObject o;
    if (d) {
        for (qsizetype idx = 0; idx < d->elements.size(); idx += 2)
            o.insert(makeString(d, idx), qt_convertToJson(d, idx + 1, mode));
    }
    return o;
}